

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

size_t ma_dr_wav__on_read_memory(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  ulong __n;
  
  __n = *(long *)((long)pUserData + 200) - *(long *)((long)pUserData + 0xd0);
  if (bytesToRead <= __n) {
    __n = bytesToRead;
  }
  if (__n != 0) {
    memcpy(pBufferOut,
           (void *)(*(long *)((long)pUserData + 0xd0) + *(long *)((long)pUserData + 0xc0)),__n);
    *(long *)((long)pUserData + 0xd0) = *(long *)((long)pUserData + 0xd0) + __n;
  }
  return __n;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__on_read_memory(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    ma_dr_wav* pWav = (ma_dr_wav*)pUserData;
    size_t bytesRemaining;
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(pWav->memoryStream.dataSize >= pWav->memoryStream.currentReadPos);
    bytesRemaining = pWav->memoryStream.dataSize - pWav->memoryStream.currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }
    if (bytesToRead > 0) {
        MA_DR_WAV_COPY_MEMORY(pBufferOut, pWav->memoryStream.data + pWav->memoryStream.currentReadPos, bytesToRead);
        pWav->memoryStream.currentReadPos += bytesToRead;
    }
    return bytesToRead;
}